

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O3

RunResult __thiscall
wabt::interp::Thread::DoSimdBinop<double,double>(Thread *this,BinopFunc<double,_double> *f)

{
  double dVar1;
  double dVar2;
  Value VVar3;
  Value VVar4;
  
  VVar3 = Pop(this);
  VVar4 = Pop(this);
  dVar1 = (*f)((double)VVar4.i64_,(double)VVar3.i64_);
  dVar2 = (*f)(VVar4._8_8_,VVar3._8_8_);
  VVar3._8_8_ = dVar2;
  VVar3.f64_ = (f64)dVar1;
  Push(this,VVar3);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdBinop(BinopFunc<R, T> f) {
  using ST = typename Simd128<T>::Type;
  using SR = typename Simd128<R>::Type;
  static_assert(ST::lanes == SR::lanes, "SIMD lanes don't match");
  auto rhs = Pop<ST>();
  auto lhs = Pop<ST>();
  SR result;
  for (u8 i = 0; i < SR::lanes; ++i) {
    result.v[i] = f(lhs.v[i], rhs.v[i]);
  }
  Push(result);
  return RunResult::Ok;
}